

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O0

_Bool assert_base64_encode(char *input,char *expected)

{
  int iVar1;
  int iVar2;
  size_t input_len_00;
  char *output_00;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 local_36;
  _Bool result;
  int r;
  char *output;
  int output_len;
  size_t input_len;
  char *expected_local;
  char *input_local;
  
  input_len_00 = strlen(input);
  auVar4._8_4_ = (int)(input_len_00 >> 0x20);
  auVar4._0_8_ = input_len_00;
  auVar4._12_4_ = 0x45300000;
  dVar3 = ceil(((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)input_len_00) - 4503599627370496.0)) / 3.0);
  iVar1 = (int)(dVar3 * 4.0);
  output_00 = (char *)calloc(1,(long)iVar1);
  iVar2 = hdr_base64_encode((uint8_t *)input,input_len_00,output_00,(long)iVar1);
  local_36 = false;
  if (iVar2 == 0) {
    local_36 = compare_string(expected,output_00,(long)iVar1);
  }
  free(output_00);
  return local_36;
}

Assistant:

static bool assert_base64_encode(const char* input, const char* expected)
{
    size_t input_len = strlen(input);
    int output_len = (int) (ceil(input_len / 3.0) * 4.0);

    char* output = calloc(sizeof(char), output_len);

    int r = hdr_base64_encode((uint8_t*)input, input_len, output, output_len);
    bool result = r == 0 && compare_string(expected, output, output_len);

    free(output);

    return result;
}